

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O0

void __thiscall QWidgetEffectSourcePrivate::update(QWidgetEffectSourcePrivate *this)

{
  long in_RDI;
  QWidget *in_stack_ffffffffffffffe8;
  
  *(undefined1 *)(in_RDI + 0xf0) = 1;
  QWidget::update(in_stack_ffffffffffffffe8);
  *(undefined1 *)(in_RDI + 0xf0) = 0;
  return;
}

Assistant:

void update() override
    {
        updateDueToGraphicsEffect = true;
        m_widget->update();
        updateDueToGraphicsEffect = false;
    }